

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::convertToAccurateDouble(DecimalQuantity *this)

{
  int32_t local_34;
  int32_t local_30;
  int32_t point;
  int32_t length;
  bool sign;
  char buffer [18];
  int32_t delta;
  DecimalQuantity *this_local;
  
  buffer._12_4_ = this->origDelta;
  unique0x100000aa = this;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (this->origDouble,SHORTEST,0,(char *)&length,0x12,(bool *)((long)&point + 3),&local_30,
             &local_34);
  setBcdToZero(this);
  readDoubleConversionToBcd(this,(char *)&length,local_30,local_34);
  this->scale = buffer._12_4_ + this->scale;
  this->explicitExactDouble = true;
  return;
}

Assistant:

void DecimalQuantity::convertToAccurateDouble() {
    U_ASSERT(origDouble != 0);
    int32_t delta = origDelta;

    // Call the slow oracle function (Double.toString in Java, DoubleToAscii in C++).
    char buffer[DoubleToStringConverter::kBase10MaximalLength + 1];
    bool sign; // unused; always positive
    int32_t length;
    int32_t point;
    DoubleToStringConverter::DoubleToAscii(
        origDouble,
        DoubleToStringConverter::DtoaMode::SHORTEST,
        0,
        buffer,
        sizeof(buffer),
        &sign,
        &length,
        &point
    );

    setBcdToZero();
    readDoubleConversionToBcd(buffer, length, point);
    scale += delta;
    explicitExactDouble = true;
}